

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::
RegisterTests(ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  string *test_suite_name_00;
  ostream *poVar5;
  size_type sVar6;
  char *pcVar7;
  int extraout_var;
  pointer pTVar8;
  undefined4 extraout_var_00;
  undefined1 uVar9;
  SetUpTestSuiteFunc in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_00000127;
  CodeLocation *in_stack_00000128;
  string *in_stack_00000130;
  string param_name;
  tuple<unsigned_short,_unsigned_short> *param;
  iterator __end0_2;
  iterator __begin0_2;
  ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_> *__range5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  int line;
  char *file;
  undefined1 *name_func;
  ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_> generator;
  string *instantiation_name;
  InstantiationInfo *instantiation;
  iterator __end0_1;
  iterator __begin0_1;
  InstantiationContainer *__range4;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>
  *test_info;
  iterator __end0;
  iterator __begin0;
  TestInfoContainer *__range3;
  string test_name;
  string test_suite_name;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffcb8;
  CodeLocation *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  value_type *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  CodeLocation *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffd10;
  void *in_stack_fffffffffffffd28;
  ostream *in_stack_fffffffffffffd30;
  ostream *in_stack_fffffffffffffd38;
  ostream *in_stack_fffffffffffffd40;
  ostream *in_stack_fffffffffffffd98;
  CodeLocation *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  undefined6 in_stack_fffffffffffffdb0;
  code *name;
  TearDownTestSuiteFunc in_stack_fffffffffffffdd8;
  TestFactoryBase *in_stack_fffffffffffffde0;
  undefined4 local_1fc [11];
  string local_1d0 [32];
  string local_1b0 [24];
  tuple<unsigned_short,_unsigned_short> *in_stack_fffffffffffffe68;
  GTestLog local_180;
  GTestLog local_17c;
  TestParamInfo<std::tuple<unsigned_short,_unsigned_short>_> local_178;
  string local_168 [32];
  string *local_148;
  undefined1 *local_130;
  size_t local_f8;
  string local_f0 [36];
  int local_cc;
  char *local_c8;
  code *local_c0;
  undefined1 local_a8 [16];
  reference local_98;
  reference local_90;
  InstantiationInfo *local_88;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>_>
  local_80;
  code *local_78;
  reference local_70;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>
  *local_68;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>_>
  local_60;
  code *local_58;
  string local_50 [32];
  string local_30 [39];
  byte local_9;
  
  local_9 = 0;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  local_58 = in_RDI + 0x50;
  local_60._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>
                   *)in_stack_fffffffffffffcb8);
  local_68 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>
              *)std::
                vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>
                ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>
                       *)in_stack_fffffffffffffcb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>_>
                             *)in_stack_fffffffffffffcc0,
                            (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>_>
                             *)in_stack_fffffffffffffcb8), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>_>
               ::operator*(&local_60);
    local_78 = in_RDI + 0x68;
    local_80._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffcb8);
    local_88 = (InstantiationInfo *)
               std::
               vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>
               ::end((vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>
                      *)in_stack_fffffffffffffcb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>_>
                               *)in_stack_fffffffffffffcc0,
                              (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>_>
                               *)in_stack_fffffffffffffcb8), bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>_>
                 ::operator*(&local_80);
      local_90 = local_98;
      (*(code *)local_98->generator)(local_a8);
      local_c0 = (code *)local_90->name_func;
      local_c8 = local_90->file;
      local_cc = local_90->line;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::operator+(&in_stack_fffffffffffffce8->file,(char *)in_stack_fffffffffffffce0);
        std::__cxx11::string::operator=(local_30,local_f0);
        std::__cxx11::string::~string(local_f0);
      }
      else {
        std::__cxx11::string::clear();
      }
      std::__cxx11::string::operator+=(local_30,(string *)(in_RDI + 8));
      local_f8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1a0a3e);
      local_130 = local_a8;
      ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_>::begin
                ((ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_> *)
                 in_stack_fffffffffffffcc8);
      ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_>::end
                ((ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_> *)
                 in_stack_fffffffffffffcc8);
      while (bVar1 = ParamIterator<std::tuple<unsigned_short,_unsigned_short>_>::operator!=
                               ((ParamIterator<std::tuple<unsigned_short,_unsigned_short>_> *)
                                in_stack_fffffffffffffcc0,
                                (ParamIterator<std::tuple<unsigned_short,_unsigned_short>_> *)
                                in_stack_fffffffffffffcb8), bVar1) {
        test_suite_name_00 =
             (string *)
             ParamIterator<std::tuple<unsigned_short,_unsigned_short>_>::operator*
                       ((ParamIterator<std::tuple<unsigned_short,_unsigned_short>_> *)0x1a0b20);
        local_9 = 1;
        local_148 = test_suite_name_00;
        std::__cxx11::string::clear();
        name = local_c0;
        TestParamInfo<std::tuple<unsigned_short,_unsigned_short>_>::TestParamInfo
                  (&local_178,(tuple<unsigned_short,_unsigned_short> *)local_148,local_f8);
        (*name)(local_168,&local_178);
        condition = IsValidParamName(in_stack_fffffffffffffcc8);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)in_stack_fffffffffffffd40,
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                             (char *)in_stack_fffffffffffffd30,
                             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          poVar5 = GTestLog::GetStream(&local_17c);
          in_stack_fffffffffffffda8 =
               std::operator<<(poVar5,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffda0 =
               (CodeLocation *)
               std::operator<<(in_stack_fffffffffffffda8,"Parameterized test name \'");
          in_stack_fffffffffffffd98 =
               std::operator<<((ostream *)in_stack_fffffffffffffda0,local_168);
          poVar5 = std::operator<<(in_stack_fffffffffffffd98,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar5 = std::operator<<(poVar5,local_c8);
          poVar5 = std::operator<<(poVar5," line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_cc);
          poVar5 = std::operator<<(poVar5,"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffcc0);
        }
        sVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        bVar1 = IsTrue(sVar6 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)in_stack_fffffffffffffd40,
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                             (char *)in_stack_fffffffffffffd30,
                             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          poVar5 = GTestLog::GetStream(&local_180);
          poVar5 = std::operator<<(poVar5,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar5 = std::operator<<(poVar5,"Duplicate parameterized test name \'");
          poVar5 = std::operator<<(poVar5,local_168);
          in_stack_fffffffffffffd40 = std::operator<<(poVar5,"\', in ");
          in_stack_fffffffffffffd38 = std::operator<<(in_stack_fffffffffffffd40,local_c8);
          in_stack_fffffffffffffd30 = std::operator<<(in_stack_fffffffffffffd38," line ");
          in_stack_fffffffffffffd28 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd30,local_cc);
          std::ostream::operator<<(in_stack_fffffffffffffd28,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffcc0);
        }
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a0ef3);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a0f0c);
          pcVar7 = (char *)std::__cxx11::string::append(local_50);
          std::__cxx11::string::append(pcVar7);
        }
        std::__cxx11::string::operator+=(local_50,local_168);
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        uVar9 = pVar10.second;
        std::__cxx11::string::string(local_1b0,local_30);
        std::__cxx11::string::c_str();
        iVar3 = extraout_var;
        PrintToString<std::tuple<unsigned_short,unsigned_short>>(in_stack_fffffffffffffe68);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a0fe6);
        CodeLocation::CodeLocation(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        (**(code **)(*(long *)in_RDI + 0x18))();
        in_stack_fffffffffffffcb8 =
             (CodeLocation *)
             SuiteApiResolver<CheckValidRepresentationOfFlexfloat5_10>::GetSetUpCaseOrSuite
                       ((char *)CONCAT17(uVar9,in_stack_fffffffffffffd10),iVar3);
        in_stack_fffffffffffffcc0 =
             (CodeLocation *)
             SuiteApiResolver<CheckValidRepresentationOfFlexfloat5_10>::GetTearDownCaseOrSuite
                       ((char *)CONCAT17(uVar9,in_stack_fffffffffffffd10),iVar3);
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a1057);
        pTVar8 = std::
                 unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_short,_unsigned_short>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_short,_unsigned_short>_>_>_>
                 ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_short,_unsigned_short>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_short,_unsigned_short>_>_>_>
                               *)0x1a1063);
        local_1fc[0] = *(undefined4 *)local_148;
        iVar3 = (*pTVar8->_vptr_TestMetaFactoryBase[2])(pTVar8,local_1fc);
        in_stack_fffffffffffffcc8 = (string *)CONCAT44(extraout_var_00,iVar3);
        in_stack_fffffffffffffce0 = in_stack_fffffffffffffcc8;
        in_stack_fffffffffffffce8 = in_stack_fffffffffffffcc0;
        MakeAndRegisterTestInfo
                  (test_suite_name_00,(char *)name,
                   (char *)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffdb0)),
                   (char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                   in_stack_fffffffffffffd98,in_RDI,in_stack_fffffffffffffdd8,
                   in_stack_fffffffffffffde0);
        CodeLocation::~CodeLocation((CodeLocation *)0x1a10e3);
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string(local_1b0);
        local_f8 = local_f8 + 1;
        std::__cxx11::string::~string(local_168);
        ParamIterator<std::tuple<unsigned_short,_unsigned_short>_>::operator++
                  ((ParamIterator<std::tuple<unsigned_short,_unsigned_short>_> *)
                   in_stack_fffffffffffffcc0);
      }
      ParamIterator<std::tuple<unsigned_short,_unsigned_short>_>::~ParamIterator
                ((ParamIterator<std::tuple<unsigned_short,_unsigned_short>_> *)0x1a0ab6);
      ParamIterator<std::tuple<unsigned_short,_unsigned_short>_>::~ParamIterator
                ((ParamIterator<std::tuple<unsigned_short,_unsigned_short>_> *)0x1a0ac3);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1a11cf);
      ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_>::~ParamGenerator
                ((ParamGenerator<std::tuple<unsigned_short,_unsigned_short>_> *)0x1a11dc);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::InstantiationInfo>_>_>
      ::operator++(&local_80);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>_>
    ::operator++(&local_60);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*(long *)in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<CheckValidRepresentationOfFlexfloat5_10>::TestInfo>_>_>
             *)in_stack_fffffffffffffcd0);
    InsertSyntheticTestCase(in_stack_00000130,in_stack_00000128,in_stack_00000127);
    CodeLocation::~CodeLocation((CodeLocation *)0x1a1299);
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }